

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RootObjectBase.cpp
# Opt level: O2

void __thiscall
Js::RootObjectInlineCache::RootObjectInlineCache
          (RootObjectInlineCache *this,InlineCacheAllocator *allocator)

{
  InlineCache *ptr;
  
  this->refCount = 1;
  (this->inlineCache).ptr = (InlineCache *)0x0;
  ptr = (InlineCache *)new<Memory::InlineCacheAllocator>(0x20,allocator,0x6dbe44);
  Memory::WriteBarrierPtr<Js::InlineCache>::WriteBarrierSet(&this->inlineCache,ptr);
  return;
}

Assistant:

RootObjectInlineCache::RootObjectInlineCache(InlineCacheAllocator * allocator):
        inlineCache(nullptr), refCount(1)
    {
        inlineCache = AllocatorNewZ(InlineCacheAllocator,
            allocator, Js::InlineCache);
    }